

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall
Minisat::Solver::analyze
          (Solver *this,CRef confl,vec<Minisat::Lit,_int> *out_learnt,int *out_btlevel)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  double *pdVar5;
  VarData *pVVar6;
  bool bVar7;
  uint uVar8;
  Lit *pLVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  Lit p;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  float fVar23;
  Lit q;
  Lit local_4c;
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *local_48;
  Size *local_40;
  int *local_38;
  
  uVar19 = (ulong)confl;
  local_38 = out_btlevel;
  vec<Minisat::Lit,_int>::push(out_learnt);
  iVar20 = (this->trail).sz + -1;
  local_48 = &this->order_heap;
  uVar8 = 0xfffffffe;
  iVar21 = 0;
  do {
    if ((uint)uVar19 == 0xffffffff) {
      __assert_fail("confl != CRef_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                    ,0x133,"void Minisat::Solver::analyze(CRef, vec<Lit> &, int &)");
    }
    uVar10 = (this->ca).ra.sz;
    if (uVar10 <= (uint)uVar19) goto LAB_00109600;
    puVar1 = (this->ca).ra.memory + uVar19;
    uVar12 = *puVar1;
    if ((uVar12 & 4) != 0) {
      if ((uVar12 & 8) == 0) {
LAB_0010961f:
        __assert_fail("header.has_extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                      ,0xd6,"float &Minisat::Clause::activity()");
      }
      dVar22 = this->cla_inc;
      fVar23 = (float)((double)(float)puVar1[(ulong)(uVar12 >> 5) + 1] + dVar22);
      puVar1[(ulong)(uVar12 >> 5) + 1] = (uint)fVar23;
      if (1e+20 < fVar23) {
        lVar13 = (long)(this->learnts).sz;
        if (0 < lVar13) {
          puVar3 = (this->learnts).data;
          puVar4 = (this->ca).ra.memory;
          lVar17 = 0;
          do {
            uVar12 = puVar3[lVar17];
            if (uVar10 <= uVar12) goto LAB_00109600;
            if ((puVar4[uVar12] & 8) == 0) goto LAB_0010961f;
            uVar19 = (ulong)(puVar4[uVar12] >> 5);
            puVar4[(ulong)uVar12 + uVar19 + 1] =
                 (uint)((float)puVar4[(ulong)uVar12 + uVar19 + 1] * 1e-20);
            lVar17 = lVar17 + 1;
          } while (lVar13 != lVar17);
        }
        this->cla_inc = dVar22 * 1e-20;
        uVar12 = *puVar1;
      }
    }
    if ((uint)(uVar8 != 0xfffffffe) < uVar12 >> 5) {
      uVar19 = (ulong)(uVar8 != 0xfffffffe);
      do {
        local_4c.x = puVar1[uVar19 + 1];
        iVar15 = local_4c.x >> 1;
        iVar16 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz;
        if (iVar16 <= iVar15) goto LAB_001095ab;
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar15] ==
            '\0') {
          if ((this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
              iVar15) goto LAB_001095e1;
          if (0 < (this->vardata).
                  super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                  data[iVar15].level) {
            uVar8 = (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.sz
            ;
            if ((int)uVar8 <= iVar15) {
LAB_001095c2:
              pcVar11 = 
              "V &Minisat::IntMap<int, double>::operator[](K) [K = int, V = double, MkIndex = Minisat::MkIndexDefault<int>]"
              ;
              goto LAB_001095d7;
            }
            pdVar5 = (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.
                     data;
            dVar22 = this->var_inc + pdVar5[iVar15];
            pdVar5[iVar15] = dVar22;
            if (1e+100 < dVar22) {
              iVar2 = this->next_var;
              if (0 < (long)iVar2) {
                uVar14 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar14 = 0;
                }
                uVar18 = 0;
                do {
                  if (uVar14 == uVar18) goto LAB_001095c2;
                  pdVar5[uVar18] = pdVar5[uVar18] * 1e-100;
                  uVar18 = uVar18 + 1;
                } while ((long)iVar2 != uVar18);
              }
              this->var_inc = this->var_inc * 1e-100;
            }
            if ((iVar15 < (this->order_heap).indices.map.sz) &&
               (-1 < (this->order_heap).indices.map.data[iVar15])) {
              Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::decrease
                        (local_48,iVar15);
              iVar16 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz;
              iVar15 = local_4c.x >> 1;
            }
            if (iVar16 <= iVar15) goto LAB_001095ab;
            (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar15] =
                 '\x01';
            if ((this->vardata).
                super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
                local_4c.x >> 1) goto LAB_001095e1;
            if ((this->vardata).
                super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
                [local_4c.x >> 1].level < (this->trail_lim).sz) {
              vec<Minisat::Lit,_int>::push(out_learnt,&local_4c);
            }
            else {
              iVar21 = iVar21 + 1;
            }
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < *puVar1 >> 5);
    }
    pcVar11 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
    pLVar9 = (this->trail).data + iVar20;
    do {
      uVar8 = pLVar9->x;
      iVar16 = (int)uVar8 >> 1;
      if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar16)
      goto LAB_001095ab;
      pLVar9 = pLVar9 + -1;
      iVar20 = iVar20 + -1;
    } while (pcVar11[iVar16] == '\0');
    if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.
        map.sz <= iVar16) goto LAB_001095e1;
    uVar19 = (ulong)(this->vardata).
                    super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                    data[iVar16].reason;
    pcVar11[iVar16] = '\0';
    bVar7 = 1 < iVar21;
    iVar21 = iVar21 + -1;
  } while (bVar7);
  out_learnt->data->x = uVar8 ^ 1;
  vec<Minisat::Lit,_int>::copyTo(out_learnt,&this->analyze_toclear);
  uVar8 = out_learnt->sz;
  uVar19 = (ulong)uVar8;
  if (this->ccmin_mode == 2) {
    uVar10 = 1;
    uVar19 = 1;
    if (1 < (int)uVar8) {
      uVar19 = 1;
      do {
        pLVar9 = out_learnt->data;
        p.x = pLVar9[uVar19].x;
        if ((this->vardata).
            super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
            p.x >> 1) goto LAB_001095e1;
        if ((this->vardata).
            super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
            [p.x >> 1].reason == 0xffffffff) {
LAB_0010946e:
          lVar13 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          pLVar9[lVar13].x = p.x;
        }
        else {
          bVar7 = litRedundant(this,p);
          if (!bVar7) {
            pLVar9 = out_learnt->data;
            p.x = pLVar9[uVar19].x;
            goto LAB_0010946e;
          }
        }
        uVar19 = uVar19 + 1;
        uVar8 = out_learnt->sz;
      } while ((long)uVar19 < (long)(int)uVar8);
    }
  }
  else {
    uVar10 = uVar8;
    if (this->ccmin_mode == 1) {
      uVar10 = 1;
      uVar19 = 1;
      if (1 < (int)uVar8) {
        pLVar9 = out_learnt->data;
        pVVar6 = (this->vardata).
                 super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
        ;
        local_48 = (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *)
                   (this->ca).ra.memory;
        local_40 = &(local_48->heap).sz;
        uVar19 = 1;
        do {
          iVar21 = pLVar9[uVar19].x;
          iVar16 = iVar21 >> 1;
          iVar20 = (this->vardata).
                   super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz
          ;
          if (iVar20 <= iVar16) goto LAB_001095e1;
          uVar8 = pVVar6[iVar16].reason;
          uVar14 = (ulong)uVar8;
          if (uVar14 == 0xffffffff) {
LAB_00109404:
            lVar13 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            pLVar9[lVar13].x = iVar21;
          }
          else {
            if ((this->ca).ra.sz <= uVar8) {
LAB_00109600:
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            uVar8 = *(uint *)((long)&(local_48->heap).data + uVar14 * 4);
            if (0x3f < uVar8) {
              lVar13 = 0;
              do {
                iVar16 = local_40[uVar14 + lVar13] >> 1;
                if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
                    iVar16) goto LAB_001095ab;
                if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
                    [iVar16] == '\0') {
                  if (iVar20 <= iVar16) goto LAB_001095e1;
                  if (0 < pVVar6[iVar16].level) goto LAB_00109404;
                }
                lVar13 = lVar13 + 1;
              } while ((ulong)(uVar8 >> 5) - 1 != lVar13);
            }
          }
          uVar19 = uVar19 + 1;
          uVar8 = out_learnt->sz;
        } while ((long)uVar19 < (long)(int)uVar8);
      }
    }
  }
  lVar13 = (long)(int)uVar8;
  this->max_literals = this->max_literals + lVar13;
  iVar21 = (int)uVar19 - uVar10;
  uVar10 = uVar8 - iVar21;
  if ((int)uVar8 < iVar21) {
    __assert_fail("nelems <= sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                  ,0x41,
                  "void Minisat::vec<Minisat::Lit>::shrink(Size) [T = Minisat::Lit, _Size = int]");
  }
  if (0 < iVar21) {
    out_learnt->sz = uVar10;
    lVar13 = (long)(int)uVar10;
    uVar8 = uVar10;
  }
  this->tot_literals = this->tot_literals + lVar13;
  iVar21 = 0;
  if (uVar8 != 1) {
    pLVar9 = out_learnt->data;
    lVar13 = 1;
    if (2 < (int)uVar8) {
      iVar21 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
      pVVar6 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      iVar20 = 1;
      uVar19 = 2;
      do {
        iVar16 = pLVar9[uVar19].x >> 1;
        if ((iVar21 <= iVar16) || (iVar15 = pLVar9[iVar20].x >> 1, iVar21 <= iVar15))
        goto LAB_001095e1;
        iVar2 = (int)uVar19;
        if (pVVar6[iVar16].level <= pVVar6[iVar15].level) {
          iVar2 = iVar20;
        }
        iVar20 = iVar2;
        uVar19 = uVar19 + 1;
      } while (uVar8 != uVar19);
      lVar13 = (long)iVar20;
    }
    iVar21 = pLVar9[lVar13].x;
    pLVar9[lVar13].x = pLVar9[1].x;
    pLVar9[1].x = iVar21;
    iVar21 = iVar21 >> 1;
    if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.
        map.sz <= iVar21) {
LAB_001095e1:
      __assert_fail("has(k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                    ,0x27,
                    "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
                   );
    }
    iVar21 = (this->vardata).
             super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
             [iVar21].level;
  }
  *local_38 = iVar21;
  if (0 < (this->analyze_toclear).sz) {
    lVar13 = 0;
    do {
      iVar21 = (this->analyze_toclear).data[lVar13].x >> 1;
      if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar21) {
LAB_001095ab:
        pcVar11 = 
        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_001095d7:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,pcVar11);
      }
      (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar21] = '\0';
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->analyze_toclear).sz);
  }
  return;
}

Assistant:

void Solver::analyze(CRef confl, vec<Lit>& out_learnt, int& out_btlevel)
{
    int pathC = 0;
    Lit p     = lit_Undef;

    // Generate conflict clause:
    //
    out_learnt.push();      // (leave room for the asserting literal)
    int index   = trail.size() - 1;

    do{
        assert(confl != CRef_Undef); // (otherwise should be UIP)
        Clause& c = ca[confl];

        if (c.learnt())
            claBumpActivity(c);

        for (int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++){
            Lit q = c[j];

            if (!seen[var(q)] && level(var(q)) > 0){
                varBumpActivity(var(q));
                seen[var(q)] = 1;
                if (level(var(q)) >= decisionLevel())
                    pathC++;
                else
                    out_learnt.push(q);
            }
        }
        
        // Select next clause to look at:
        while (!seen[var(trail[index--])]);
        p     = trail[index+1];
        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    }while (pathC > 0);
    out_learnt[0] = ~p;

    // Simplify conflict clause:
    //
    int i, j;
    out_learnt.copyTo(analyze_toclear);
    if (ccmin_mode == 2){
        for (i = j = 1; i < out_learnt.size(); i++)
            if (reason(var(out_learnt[i])) == CRef_Undef || !litRedundant(out_learnt[i]))
                out_learnt[j++] = out_learnt[i];
        
    }else if (ccmin_mode == 1){
        for (i = j = 1; i < out_learnt.size(); i++){
            Var x = var(out_learnt[i]);

            if (reason(x) == CRef_Undef)
                out_learnt[j++] = out_learnt[i];
            else{
                Clause& c = ca[reason(var(out_learnt[i]))];
                for (int k = 1; k < c.size(); k++)
                    if (!seen[var(c[k])] && level(var(c[k])) > 0){
                        out_learnt[j++] = out_learnt[i];
                        break; }
            }
        }
    }else
        i = j = out_learnt.size();

    max_literals += out_learnt.size();
    out_learnt.shrink(i - j);
    tot_literals += out_learnt.size();

    // Find correct backtrack level:
    //
    if (out_learnt.size() == 1)
        out_btlevel = 0;
    else{
        int max_i = 1;
        // Find the first literal assigned at the next-highest level:
        for (int i = 2; i < out_learnt.size(); i++)
            if (level(var(out_learnt[i])) > level(var(out_learnt[max_i])))
                max_i = i;
        // Swap-in this literal at index 1:
        Lit p             = out_learnt[max_i];
        out_learnt[max_i] = out_learnt[1];
        out_learnt[1]     = p;
        out_btlevel       = level(var(p));
    }

    for (int j = 0; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0;    // ('seen[]' is now cleared)
}